

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_forgetful_chain_inc.h
# Opt level: O0

void PrepareH41(HasherHandle handle,int one_shot,size_t input_size,uint8_t *data)

{
  HasherHandle puVar1;
  ulong uVar2;
  size_t bucket;
  size_t i;
  size_t partial_prepare_threshold;
  H41 *self;
  uint8_t *data_local;
  size_t input_size_local;
  int one_shot_local;
  HasherHandle handle_local;
  uint32_t h;
  
  if ((one_shot == 0) || (0x200 < input_size)) {
    memset(handle + 0x28,0xcc,0x20000);
    memset(handle + 0x20028,0,0x10000);
  }
  else {
    for (bucket = 0; bucket < input_size; bucket = bucket + 1) {
      uVar2 = (ulong)((uint)(*(int *)(data + bucket) * 0x1e35a7bd) >> 0x11);
      puVar1 = handle + 0x28 + uVar2 * 4;
      puVar1[0] = 0xcc;
      puVar1[1] = 0xcc;
      puVar1[2] = 0xcc;
      puVar1[3] = 0xcc;
      (handle + uVar2 * 2 + 0x20028)[0] = 0xcc;
      (handle + uVar2 * 2 + 0x20028)[1] = 0xcc;
    }
  }
  memset(handle + 0x30028,0,0x10000);
  memset(handle + 0x80028,0,2);
  return;
}

Assistant:

static void FN(Prepare)(HasherHandle handle, BROTLI_BOOL one_shot,
    size_t input_size, const uint8_t* data) {
  HashForgetfulChain* self = FN(Self)(handle);
  /* Partial preparation is 100 times slower (per socket). */
  size_t partial_prepare_threshold = BUCKET_SIZE >> 6;
  if (one_shot && input_size <= partial_prepare_threshold) {
    size_t i;
    for (i = 0; i < input_size; ++i) {
      size_t bucket = FN(HashBytes)(&data[i]);
      /* See InitEmpty comment. */
      self->addr[bucket] = 0xCCCCCCCC;
      self->head[bucket] = 0xCCCC;
    }
  } else {
    /* Fill |addr| array with 0xCCCCCCCC value. Because of wrapping, position
       processed by hasher never reaches 3GB + 64M; this makes all new chains
       to be terminated after the first node. */
    memset(self->addr, 0xCC, sizeof(self->addr));
    memset(self->head, 0, sizeof(self->head));
  }
  memset(self->tiny_hash, 0, sizeof(self->tiny_hash));
  memset(self->free_slot_idx, 0, sizeof(self->free_slot_idx));
}